

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::BindingImagesTest::prepareNextTestCase
          (BindingImagesTest *this,GLuint test_case_index)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  GLchar *local_1b8 [3];
  MessageBuilder local_1a0;
  GLuint local_1c;
  BindingImagesTest *pBStack_18;
  GLuint test_case_index_local;
  BindingImagesTest *this_local;
  
  switch(test_case_index) {
  case 1:
    this->m_test_case = TEX_BUFFER;
    break;
  case 2:
    this->m_test_case = TEX_2D_RECT;
    break;
  case 3:
    this->m_test_case = TEX_2D_ARRAY;
    break;
  case 4:
    this->m_test_case = TEX_3D;
    break;
  case 5:
    this->m_test_case = TEX_CUBE;
    break;
  case 6:
    this->m_test_case = TEX_1D;
    break;
  case 7:
    this->m_test_case = TEX_1D_ARRAY;
    break;
  case 0xffffffff:
  case 0:
    this->m_test_case = TEX_2D;
    break;
  default:
    return false;
  }
  local_1c = test_case_index;
  pBStack_18 = this;
  this_00 = deqp::Context::getTestContext
                      ((this->super_BindingImageTest).super_GLSLTestBase.super_TestBase.
                       super_TestCase.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [22])"Tested texture type: ");
  local_1b8[0] = Utils::getTextureTypeName(this->m_test_case);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1b8);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return true;
}

Assistant:

bool BindingImagesTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	switch (test_case_index)
	{
	case (glw::GLuint)-1:
	case 0:
		m_test_case = Utils::TEX_2D;
		break;
	case 1:
		m_test_case = Utils::TEX_BUFFER;
		break;
	case 2:
		m_test_case = Utils::TEX_2D_RECT;
		break;
	case 3:
		m_test_case = Utils::TEX_2D_ARRAY;
		break;
	case 4:
		m_test_case = Utils::TEX_3D;
		break;
	case 5:
		m_test_case = Utils::TEX_CUBE;
		break;
	case 6:
		m_test_case = Utils::TEX_1D;
		break;
	case 7:
		m_test_case = Utils::TEX_1D_ARRAY;
		break;
	default:
		return false;
		break;
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message
										<< "Tested texture type: " << Utils::getTextureTypeName(m_test_case)
										<< tcu::TestLog::EndMessage;

	return true;
}